

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O1

SUNErrCode SUNContext_PopErrHandler(SUNContext sunctx)

{
  SUNErrCode SVar1;
  SUNErrHandler_conflict eh;
  SUNErrHandler_conflict local_10;
  
  if (sunctx == (SUNContext)0x0) {
    SVar1 = -0x26fa;
  }
  else {
    local_10 = sunctx->err_handler;
    SVar1 = 0;
    if (local_10 != (SUNErrHandler_conflict)0x0) {
      sunctx->err_handler = local_10->previous;
      SUNErrHandler_Destroy(&local_10);
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNContext_PopErrHandler(SUNContext sunctx)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);
  if (sunctx->err_handler)
  {
    SUNErrHandler eh = sunctx->err_handler;
    if (sunctx->err_handler->previous)
    {
      sunctx->err_handler = sunctx->err_handler->previous;
    }
    else { sunctx->err_handler = NULL; }
    SUNErrHandler_Destroy(&eh);
  }
  return SUN_SUCCESS;
}